

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

void Cba_NtkPrintDistribSortOne(Vec_Ptr_t *vTypes,Vec_Ptr_t *vOccurs,int Type)

{
  int nSize;
  Vec_Wrd_t *p;
  Vec_Wrd_t *p_00;
  word *pArray;
  word *pCosts;
  Vec_Wrd_t *vOccur;
  Vec_Wrd_t *vType;
  int Type_local;
  Vec_Ptr_t *vOccurs_local;
  Vec_Ptr_t *vTypes_local;
  
  p = (Vec_Wrd_t *)Vec_PtrEntry(vTypes,Type);
  p_00 = (Vec_Wrd_t *)Vec_PtrEntry(vOccurs,Type);
  pArray = Vec_WrdArray(p);
  nSize = Vec_WrdSize(p);
  pCosts = Vec_WrdArray(p_00);
  Vec_WrdSelectSortCost2(pArray,nSize,pCosts);
  Vec_WrdReverseOrder(p);
  Vec_WrdReverseOrder(p_00);
  return;
}

Assistant:

void Cba_NtkPrintDistribSortOne( Vec_Ptr_t * vTypes, Vec_Ptr_t * vOccurs, int Type )
{
    Vec_Wrd_t * vType  = (Vec_Wrd_t *)Vec_PtrEntry( vTypes, Type );
    Vec_Wrd_t * vOccur = (Vec_Wrd_t *)Vec_PtrEntry( vOccurs, Type );
    Vec_WrdSelectSortCost2( Vec_WrdArray(vType), Vec_WrdSize(vType), Vec_WrdArray(vOccur) );
    Vec_WrdReverseOrder( vType );
    Vec_WrdReverseOrder( vOccur );
}